

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

bool anon_unknown.dwarf_18993::push_pull(EmulateRegisters *regs,Operation op)

{
  bool bVar1;
  uint8_t v;
  byte bVar2;
  uint16_t uVar3;
  uint16_t mask;
  uint32_t uVar4;
  uint8_t value_7;
  uint16_t value_6;
  uint8_t value_5;
  uint16_t value_4;
  uint8_t value_3;
  uint16_t value_2;
  uint8_t value_1;
  uint16_t value;
  bool wide;
  Operation op_local;
  EmulateRegisters *regs_local;
  
  if (op == PHA) {
    bVar1 = memory16(regs);
    if (bVar1) {
      uVar3 = snestistics::EmulateRegisters::A(regs,0xffff);
      push_word_stack(regs,uVar3);
    }
    else {
      uVar3 = snestistics::EmulateRegisters::A(regs,0xff);
      push_byte_stack(regs,(uint8_t)uVar3);
    }
  }
  else if (op == PHB) {
    v = snestistics::EmulateRegisters::DB(regs);
    push_byte_stack(regs,v);
  }
  else if (op == PHD) {
    uVar3 = snestistics::EmulateRegisters::DP(regs);
    push_word_stack(regs,uVar3);
  }
  else if (op == PHK) {
    uVar4 = snestistics::EmulateRegisters::PC(regs,0xff0000);
    push_byte_stack(regs,(uint8_t)(uVar4 >> 0x10));
  }
  else if (op == PHP) {
    uVar3 = snestistics::EmulateRegisters::P(regs,0xff);
    push_byte_stack(regs,(uint8_t)uVar3);
  }
  else if (op == PHX) {
    bVar1 = index16(regs);
    if (bVar1) {
      uVar3 = snestistics::EmulateRegisters::X(regs,0xffff);
      push_word_stack(regs,uVar3);
    }
    else {
      uVar3 = snestistics::EmulateRegisters::X(regs,0xff);
      push_byte_stack(regs,(uint8_t)uVar3);
    }
  }
  else if (op == PHY) {
    bVar1 = index16(regs);
    if (bVar1) {
      uVar3 = snestistics::EmulateRegisters::Y(regs,0xffff);
      push_word_stack(regs,uVar3);
    }
    else {
      uVar3 = snestistics::EmulateRegisters::Y(regs,0xff);
      push_byte_stack(regs,(uint8_t)uVar3);
    }
  }
  else if (op == PLA) {
    bVar1 = memory16(regs);
    if (bVar1) {
      uVar3 = pop_word_stack(regs);
    }
    else {
      bVar2 = pop_byte_stack(regs);
      uVar3 = (uint16_t)bVar2;
    }
    uVar3 = set_nz_flags(regs,uVar3,bVar1);
    mask = 0xff;
    if (bVar1) {
      mask = 0xffff;
    }
    snestistics::EmulateRegisters::set_A(regs,uVar3,mask);
  }
  else if (op == PLB) {
    bVar2 = pop_byte_stack(regs);
    uVar3 = set_nz_flags(regs,(ushort)bVar2,false);
    snestistics::EmulateRegisters::set_DB(regs,(uint8_t)uVar3);
  }
  else if (op == PLD) {
    uVar3 = pop_word_stack(regs);
    uVar3 = set_nz_flags(regs,uVar3,true);
    snestistics::EmulateRegisters::set_DP(regs,uVar3);
  }
  else if (op == PLP) {
    bVar2 = pop_byte_stack(regs);
    uVar3 = set_nz_flags(regs,(ushort)bVar2,false);
    snestistics::EmulateRegisters::set_P(regs,uVar3,0xff);
    bVar1 = index16(regs);
    if (!bVar1) {
      snestistics::EmulateRegisters::set_X(regs,0,0xff00);
      snestistics::EmulateRegisters::set_Y(regs,0,0xff00);
    }
  }
  else if (op == PLX) {
    bVar1 = index16(regs);
    if (bVar1) {
      uVar3 = pop_word_stack(regs);
      uVar3 = set_nz_flags(regs,uVar3,true);
      snestistics::EmulateRegisters::set_X(regs,uVar3,0xffff);
    }
    else {
      bVar2 = pop_byte_stack(regs);
      uVar3 = set_nz_flags(regs,(ushort)bVar2,false);
      snestistics::EmulateRegisters::set_X(regs,uVar3,0xff);
    }
  }
  else {
    if (op != PLY) {
      return false;
    }
    bVar1 = index16(regs);
    if (bVar1) {
      uVar3 = pop_word_stack(regs);
      uVar3 = set_nz_flags(regs,uVar3,true);
      snestistics::EmulateRegisters::set_Y(regs,uVar3,0xffff);
    }
    else {
      bVar2 = pop_byte_stack(regs);
      uVar3 = set_nz_flags(regs,(ushort)bVar2,false);
      snestistics::EmulateRegisters::set_Y(regs,uVar3,0xff);
    }
  }
  return true;
}

Assistant:

inline bool push_pull(EmulateRegisters &regs, const Operation op) {
	// Pushes does not set any flags
	// Most pulls set nz

	if (op == Operation::PHA) {
		if (memory16(regs)) {
			push_word_stack(regs, regs.A());
		} else {
			push_byte_stack(regs, (uint8_t)regs.A(0xFF));
		}
	} else if (op == Operation::PHB) {
		push_byte_stack(regs, regs.DB());
	} else if (op == Operation::PHD) {
		push_word_stack(regs, regs.DP());
	} else if (op == Operation::PHK) {
		push_byte_stack(regs, regs.PC(0xFF0000)>>16);
	} else if (op == Operation::PHP) {
		push_byte_stack(regs, (uint8_t)regs.P(0xFF));	
	} else if (op == Operation::PHX) {
		if (index16(regs)) {
			push_word_stack(regs, regs.X());
		} else {
			push_byte_stack(regs, (uint8_t)regs.X(0xFF));
		}
	} else if (op == Operation::PHY) {
		if (index16(regs)) {
			push_word_stack(regs, regs.Y());
		} else {
			push_byte_stack(regs, (uint8_t)regs.Y(0xFF));
		}
	} else if (op == Operation::PLA) {
		bool wide = memory16(regs);
		uint16_t value = wide ? pop_word_stack(regs) : pop_byte_stack(regs);
		regs.set_A(set_nz_flags(regs, value, wide), wide ? 0xFFFF : 0xFF);
	} else if (op == Operation::PLB) {
		uint8_t value = pop_byte_stack(regs);
		regs.set_DB((uint8_t)set_nz_flags(regs, value, false));
	} else if (op == Operation::PLD) {
		uint16_t value = pop_word_stack(regs);
		regs.set_DP(set_nz_flags(regs, value, true));
	} else if (op == Operation::PLP) {
		uint8_t value = pop_byte_stack(regs);
		regs.set_P(set_nz_flags(regs, value, false), 0xFF);
		// TODO: Can PLP affect emulation bit?
		if (!index16(regs)) {
			regs.set_X(0, 0xFF00);
			regs.set_Y(0, 0xFF00);
		}
	} else if (op == Operation::PLX) {
		if (index16(regs)) {
			uint16_t value = pop_word_stack(regs);
			regs.set_X(set_nz_flags(regs, value, true));
		} else {
			uint8_t value = pop_byte_stack(regs);
			regs.set_X(set_nz_flags(regs, value, false), 0xFF);
		}
	} else if (op == Operation::PLY) {
		if (index16(regs)) {
			uint16_t value = pop_word_stack(regs);
			regs.set_Y(set_nz_flags(regs, value, true));
		} else {
			uint8_t value = pop_byte_stack(regs);
			regs.set_Y(set_nz_flags(regs, value, false), 0xFF);
		}
	} else {
		// Not push-pull
		return false;
	}
	// We handled it!
	return true;
}